

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  undefined8 *puVar1;
  float fVar2;
  Value *this_00;
  pointer paVar3;
  aiVector3D *paVar4;
  undefined8 uVar5;
  uint32 uVar6;
  DataArrayList *pDVar7;
  ulong *puVar8;
  aiVector3D *paVar9;
  aiColor4D *paVar10;
  aiMesh *paVar11;
  uint *puVar12;
  runtime_error *prVar13;
  aiFace *paVar14;
  DataArrayList *pDVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  Value **ppVVar22;
  bool bVar23;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ulong local_68;
  DataArrayList *local_60;
  size_t local_58;
  pointer local_50;
  pointer local_48;
  ulong local_40;
  aiFace *local_38;
  
  if (node == (DDLNode *)0x0) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"No parent node for name.","");
    std::runtime_error::runtime_error(prVar13,(string *)local_88);
    *(undefined ***)prVar13 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->m_currentMesh == (aiMesh *)0x0) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"No current mesh for index data found.","");
    std::runtime_error::runtime_error(prVar13,(string *)local_88);
    *(undefined ***)prVar13 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar7 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar7 != (DataArrayList *)0x0) {
    bVar23 = pDVar7->m_dataList != (Value *)0x0;
    lVar21 = -8;
    uVar19 = 0;
    uVar17 = 0;
    pDVar15 = pDVar7;
    do {
      uVar19 = uVar19 + (uint)bVar23 * 3;
      lVar21 = lVar21 + (ulong)bVar23 * -0x10;
      uVar17 = uVar17 + bVar23;
      pDVar15 = pDVar15->m_next;
    } while (pDVar15 != (DataArrayList *)0x0);
    this->m_currentMesh->mNumFaces = (uint)uVar17;
    puVar8 = (ulong *)operator_new__(-(ulong)(uVar17 >> 0x3c != 0) | -lVar21);
    *puVar8 = uVar17;
    if (uVar17 != 0) {
      paVar14 = (aiFace *)(puVar8 + 1);
      do {
        paVar14->mNumIndices = 0;
        paVar14->mIndices = (uint *)0x0;
        paVar14 = paVar14 + 1;
      } while ((aiFace *)((long)puVar8 - lVar21) != paVar14);
    }
    this->m_currentMesh->mFaces = (aiFace *)(puVar8 + 1);
    this->m_currentMesh->mNumVertices = uVar19;
    paVar11 = this->m_currentMesh;
    uVar19 = paVar11->mNumVertices;
    paVar9 = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
    if (uVar19 != 0) {
      memset(paVar9,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar11->mVertices = paVar9;
    uVar17 = (this->m_currentVertices).m_numColors;
    if (uVar17 != 0) {
      uVar16 = 0xffffffffffffffff;
      if (uVar17 < 0x1000000000000000) {
        uVar16 = uVar17 << 4;
      }
      paVar10 = (aiColor4D *)operator_new__(uVar16);
      memset(paVar10,0,uVar17 << 4);
      this->m_currentMesh->mColors[0] = paVar10;
    }
    local_48 = (this->m_currentVertices).m_normals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_50 = (this->m_currentVertices).m_normals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_40 = uVar17;
    if (local_48 != local_50) {
      paVar11 = this->m_currentMesh;
      uVar19 = paVar11->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
      if (uVar19 != 0) {
        memset(paVar9,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar11->mNormals = paVar9;
    }
    local_58 = (this->m_currentVertices).m_numUVComps[0];
    if (local_58 != 0) {
      paVar11 = this->m_currentMesh;
      uVar19 = paVar11->mNumVertices;
      paVar9 = (aiVector3D *)operator_new__((ulong)uVar19 * 0xc);
      if (uVar19 != 0) {
        memset(paVar9,0,(((ulong)uVar19 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar11->mTextureCoords[0] = paVar9;
    }
    paVar11 = this->m_currentMesh;
    if (paVar11->mNumFaces != 0) {
      uVar17 = 0;
      uVar19 = 0;
      do {
        paVar14 = paVar11->mFaces;
        paVar14[uVar17].mNumIndices = 3;
        puVar12 = (uint *)operator_new__(0xc);
        paVar14[uVar17].mIndices = puVar12;
        if (paVar14[uVar17].mNumIndices != 0) {
          local_38 = paVar14 + uVar17;
          ppVVar22 = &pDVar7->m_dataList;
          uVar16 = (ulong)uVar19;
          lVar20 = uVar16 * 3 + 2;
          lVar21 = uVar16 << 4;
          uVar18 = 0;
          local_68 = uVar17;
          local_60 = pDVar7;
          do {
            this_00 = *ppVVar22;
            uVar6 = ODDLParser::Value::getUnsignedInt32(this_00);
            uVar17 = (ulong)(int)uVar6;
            paVar3 = (this->m_currentVertices).m_vertices.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this->m_currentVertices).m_vertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
                       -0x5555555555555555) < uVar17) {
              __assert_fail("static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                            ,0x3a4,
                            "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                           );
            }
            if ((ulong)this->m_currentMesh->mNumVertices <= uVar16 + uVar18) {
              __assert_fail("index < m_currentMesh->mNumVertices",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                            ,0x3a5,
                            "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                           );
            }
            paVar9 = this->m_currentMesh->mVertices;
            fVar2 = paVar3[uVar17].z;
            *(undefined8 *)((long)paVar9 + lVar20 * 4 + -8) = *(undefined8 *)(paVar3 + uVar17);
            (&paVar9->x)[lVar20] = fVar2;
            if (local_40 != 0) {
              paVar10 = (this->m_currentVertices).m_colors + uVar17;
              uVar5 = *(undefined8 *)&paVar10->b;
              puVar1 = (undefined8 *)((long)&this->m_currentMesh->mColors[0]->r + lVar21);
              *puVar1 = *(undefined8 *)paVar10;
              puVar1[1] = uVar5;
            }
            if (local_48 != local_50) {
              paVar3 = (this->m_currentVertices).m_normals.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar9 = this->m_currentMesh->mNormals;
              fVar2 = paVar3[uVar17].z;
              *(undefined8 *)((long)paVar9 + lVar20 * 4 + -8) = *(undefined8 *)(paVar3 + uVar17);
              (&paVar9->x)[lVar20] = fVar2;
            }
            if (local_58 != 0) {
              paVar9 = (this->m_currentVertices).m_textureCoords[0];
              paVar4 = this->m_currentMesh->mTextureCoords[0];
              fVar2 = paVar9[uVar17].z;
              *(undefined8 *)((long)paVar4 + lVar20 * 4 + -8) = *(undefined8 *)(paVar9 + uVar17);
              (&paVar4->x)[lVar20] = fVar2;
            }
            local_38->mIndices[uVar18] = uVar19 + (int)uVar18;
            ppVVar22 = &this_00->m_next;
            uVar18 = uVar18 + 1;
            lVar20 = lVar20 + 3;
            lVar21 = lVar21 + 0x10;
          } while (uVar18 < local_38->mNumIndices);
          uVar19 = uVar19 + (int)uVar18;
          pDVar7 = local_60;
          uVar17 = local_68;
        }
        pDVar7 = pDVar7->m_next;
        uVar17 = uVar17 + 1;
        paVar11 = this->m_currentMesh;
      } while (uVar17 < paVar11->mNumFaces);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleIndexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    if( nullptr == m_currentMesh ) {
        throw DeadlyImportError( "No current mesh for index data found." );
        return;
    }

    DataArrayList *vaList = node->getDataArrayList();
    if( nullptr == vaList ) {
        return;
    }

    const size_t numItems( countDataArrayListItems( vaList ) );
    m_currentMesh->mNumFaces = static_cast<unsigned int>(numItems);
    m_currentMesh->mFaces = new aiFace[ numItems ];
    m_currentMesh->mNumVertices = static_cast<unsigned int>(numItems * 3);
    m_currentMesh->mVertices = new aiVector3D[ m_currentMesh->mNumVertices ];
    bool hasColors( false );
    if ( m_currentVertices.m_numColors > 0 ) {
        m_currentMesh->mColors[0] = new aiColor4D[ m_currentVertices.m_numColors ];
        hasColors = true;
    }
    bool hasNormalCoords( false );
    if ( !m_currentVertices.m_normals.empty() ) {
        m_currentMesh->mNormals = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasNormalCoords = true;
    }
    bool hasTexCoords( false );
    if ( m_currentVertices.m_numUVComps[ 0 ] > 0 ) {
        m_currentMesh->mTextureCoords[ 0 ] = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasTexCoords = true;
    }

    unsigned int index( 0 );
    for( size_t i = 0; i < m_currentMesh->mNumFaces; i++ ) {
        aiFace &current(  m_currentMesh->mFaces[ i ] );
        current.mNumIndices = 3;
        current.mIndices = new unsigned int[ current.mNumIndices ];
        Value *next( vaList->m_dataList );
        for( size_t indices = 0; indices < current.mNumIndices; indices++ ) {
            const int idx( next->getUnsignedInt32() );
            ai_assert( static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size() );
            ai_assert( index < m_currentMesh->mNumVertices );
            aiVector3D &pos = ( m_currentVertices.m_vertices[ idx ] );
            m_currentMesh->mVertices[ index ].Set( pos.x, pos.y, pos.z );
            if ( hasColors ) {
                aiColor4D &col = m_currentVertices.m_colors[ idx ];
                m_currentMesh->mColors[ 0 ][ index ] = col;
            }
            if ( hasNormalCoords ) {
                aiVector3D &normal = ( m_currentVertices.m_normals[ idx ] );
                m_currentMesh->mNormals[ index ].Set( normal.x, normal.y, normal.z );
            }
            if ( hasTexCoords ) {
                aiVector3D &tex = ( m_currentVertices.m_textureCoords[ 0 ][ idx ] );
                m_currentMesh->mTextureCoords[ 0 ][ index ].Set( tex.x, tex.y, tex.z );
            }
            current.mIndices[ indices ] = index;
            index++;

            next = next->m_next;
        }
        vaList = vaList->m_next;
    }
}